

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TableImport::~TableImport(TableImport *this)

{
  TableImport *this_local;
  
  ~TableImport(this);
  operator_delete(this);
  return;
}

Assistant:

explicit TableImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Table>(), table(name) {}